

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O3

shared_ptr<vmips::VirtReg> __thiscall
vmips::CFGNode::append<vmips::lw,std::shared_ptr<vmips::MemoryLocation>>
          (CFGNode *this,shared_ptr<vmips::MemoryLocation> *args)

{
  shared_ptr<vmips::MemoryLocation> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<vmips::VirtReg> sVar2;
  shared_ptr<vmips::lw> instr;
  shared_ptr<vmips::Instruction> local_38;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  vmips::VirtReg::create();
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<vmips::lw,std::allocator<vmips::lw>,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::MemoryLocation>>
            (&local_20,(lw **)&local_28,(allocator<vmips::lw> *)&local_38,
             (shared_ptr<vmips::VirtReg> *)this,in_RDX);
  local_38.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28;
  local_38.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_20._M_pi;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
    }
  }
  std::
  vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>::
  emplace_back<std::shared_ptr<vmips::Instruction>>
            ((vector<std::shared_ptr<vmips::Instruction>,std::allocator<std::shared_ptr<vmips::Instruction>>>
              *)(args + 3),&local_38);
  _Var1._M_pi = extraout_RDX;
  if (local_38.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<vmips::Instruction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
    _Var1._M_pi = extraout_RDX_01;
  }
  sVar2.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<vmips::VirtReg>)
         sVar2.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<VirtReg> append(Args &&...args) {
            auto ret = VirtReg::create();
            auto instr = std::make_shared<Instr>(ret, std::forward<Args>(args)...);
            instructions.push_back(instr);
            return ret;
        }